

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::MergeReturnPass::CreateReturn(MergeReturnPass *this,BasicBlock *block)

{
  InstructionList *this_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_01;
  IRContext *pIVar1;
  DecorationManager *this_02;
  array<signed_char,_4UL> to;
  uint32_t from;
  mapped_type *ppBVar2;
  Instruction *pIVar3;
  uint32_t loadId;
  Op local_dc;
  array<signed_char,_4UL> local_d8;
  uint local_d4;
  IRContext *local_d0;
  undefined1 local_c8 [40];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_a0;
  IntrusiveList<spvtools::opt::Instruction> *local_90;
  mapped_type local_88;
  Instruction *local_80;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  Instruction *local_50;
  int local_44;
  initializer_list<spvtools::opt::Operand> local_40;
  
  AddReturnValue(this);
  if (this->return_value_ == (Instruction *)0x0) {
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    pIVar3 = (Instruction *)operator_new(0x70);
    Instruction::Instruction(pIVar3,pIVar1,OpReturn);
    utils::IntrusiveList<spvtools::opt::Instruction>::push_back
              (&(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar3);
  }
  else {
    local_d8._M_elems = (_Type)Pass::TakeNextId((Pass *)this);
    local_d0 = (this->super_MemPass).super_Pass.context_;
    local_dc = OpLoad;
    this_01._M_head_impl =
         (this->function_->def_inst_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_d4 = 0;
    if ((this_01._M_head_impl)->has_type_id_ == true) {
      local_d4 = Instruction::GetSingleWordOperand(this_01._M_head_impl,0);
    }
    pIVar3 = this->return_value_;
    if (pIVar3->has_result_id_ == true) {
      local_78._16_4_ = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
    }
    local_78._24_8_ = local_78 + 0x10;
    local_78._0_8_ = &PTR__SmallVector_00b15d78;
    local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_78._8_8_ = 1;
    local_c8._0_4_ = 1;
    local_c8._8_8_ = &PTR__SmallVector_00b15d78;
    local_c8._16_8_ = (pointer)0x0;
    local_c8._32_8_ = local_c8 + 0x18;
    local_a0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),
               (SmallVector<unsigned_int,_2UL> *)local_78);
    local_40._M_array = (iterator)local_c8;
    local_40._M_len = 1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_50,&local_d0,&local_dc,&local_d4,(uint *)&local_d8,&local_40);
    pIVar3 = local_50;
    this_00 = &block->insts_;
    local_50 = (Instruction *)0x0;
    utils::IntrusiveList<spvtools::opt::Instruction>::push_back
              (&this_00->super_IntrusiveList<spvtools::opt::Instruction>,pIVar3);
    if (local_50 != (Instruction *)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
    local_50 = (Instruction *)0x0;
    local_c8._8_8_ = &PTR__SmallVector_00b15d78;
    if (local_a0._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_a0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_a0._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_a0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_78._0_8_ = &PTR__SmallVector_00b15d78;
    if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_58,local_58._M_head_impl);
    }
    pIVar3 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar3 == (Instruction *)0x0) ||
       ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
    goto LAB_005c3d96;
    pIVar3 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      analysis::DefUseManager::AnalyzeInstDefUse
                ((pIVar1->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,pIVar3);
    }
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    local_c8._0_8_ = pIVar3;
    if ((pIVar1->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
      ppBVar2 = std::__detail::
                _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&pIVar1->instr_to_block_,(key_type *)local_c8);
      *ppBVar2 = block;
    }
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    local_90 = &this_00->super_IntrusiveList<spvtools::opt::Instruction>;
    if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
      IRContext::BuildDecorationManager(pIVar1);
    }
    this_02 = (pIVar1->decoration_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
              _M_head_impl;
    pIVar3 = this->return_value_;
    from = 0;
    if (pIVar3->has_result_id_ == true) {
      from = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
    }
    to._M_elems = local_d8._M_elems;
    local_c8._0_8_ = (key_type)0x0;
    local_c8._8_8_ = (_func_int **)0x0;
    local_c8._16_8_ = (pointer)0x0;
    local_88 = block;
    local_c8._0_8_ = operator_new(4);
    local_c8._8_8_ =
         (long)&(((key_type)local_c8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                _vptr_IntrusiveNodeBase + 4;
    *(undefined4 *)
     &(((key_type)local_c8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase = 0;
    local_c8._16_8_ = local_c8._8_8_;
    analysis::DecorationManager::CloneDecorations
              (this_02,from,(uint32_t)to._M_elems,
               (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)local_c8);
    if ((key_type)local_c8._0_8_ != (key_type)0x0) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ - local_c8._0_8_);
    }
    local_d0 = (this->super_MemPass).super_Pass.context_;
    local_dc = OpReturnValue;
    local_d4 = 0;
    local_44 = 0;
    local_78._0_8_ = &PTR__SmallVector_00b15d78;
    local_78._24_8_ = local_78 + 0x10;
    local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_78[0x10] = local_d8._M_elems[0];
    local_78[0x11] = local_d8._M_elems[1];
    local_78[0x12] = local_d8._M_elems[2];
    local_78[0x13] = local_d8._M_elems[3];
    local_78._8_8_ = 1;
    local_c8._0_4_ = 1;
    local_c8._8_8_ = &PTR__SmallVector_00b15d78;
    local_c8._16_8_ = (pointer)0x0;
    local_c8._32_8_ = local_c8 + 0x18;
    local_a0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),
               (SmallVector<unsigned_int,_2UL> *)local_78);
    local_40._M_len = 1;
    local_40._M_array = (iterator)local_c8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_80,&local_d0,&local_dc,(int *)&local_d4,&local_44,&local_40);
    pIVar3 = local_80;
    local_80 = (Instruction *)0x0;
    utils::IntrusiveList<spvtools::opt::Instruction>::push_back(local_90,pIVar3);
    if (local_80 != (Instruction *)0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
    block = local_88;
    local_80 = (Instruction *)0x0;
    local_c8._8_8_ = &PTR__SmallVector_00b15d78;
    if (local_a0._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_a0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_a0._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_a0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_78._0_8_ = &PTR__SmallVector_00b15d78;
    if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_58,local_58._M_head_impl);
    }
  }
  pIVar3 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar3 != (Instruction *)0x0) &&
     ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      analysis::DefUseManager::AnalyzeInstDefUse
                ((pIVar1->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,
                 (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
    }
    pIVar3 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar3 != (Instruction *)0x0) &&
       ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      local_c8._0_8_ =
           (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
      if ((pIVar1->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
        ppBVar2 = std::__detail::
                  _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pIVar1->instr_to_block_,(key_type *)local_c8);
        *ppBVar2 = block;
      }
      return;
    }
  }
LAB_005c3d96:
  __assert_fail("!insts_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
}

Assistant:

void MergeReturnPass::CreateReturn(BasicBlock* block) {
  AddReturnValue();

  if (return_value_) {
    // Load and return the final return value
    uint32_t loadId = TakeNextId();
    block->AddInstruction(MakeUnique<Instruction>(
        context(), spv::Op::OpLoad, function_->type_id(), loadId,
        std::initializer_list<Operand>{
            {SPV_OPERAND_TYPE_ID, {return_value_->result_id()}}}));
    Instruction* var_inst = block->terminator();
    context()->AnalyzeDefUse(var_inst);
    context()->set_instr_block(var_inst, block);
    context()->get_decoration_mgr()->CloneDecorations(
        return_value_->result_id(), loadId,
        {spv::Decoration::RelaxedPrecision});

    block->AddInstruction(MakeUnique<Instruction>(
        context(), spv::Op::OpReturnValue, 0, 0,
        std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {loadId}}}));
    context()->AnalyzeDefUse(block->terminator());
    context()->set_instr_block(block->terminator(), block);
  } else {
    block->AddInstruction(
        MakeUnique<Instruction>(context(), spv::Op::OpReturn));
    context()->AnalyzeDefUse(block->terminator());
    context()->set_instr_block(block->terminator(), block);
  }
}